

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionMetadata.cpp
# Opt level: O0

bool Js::JavascriptExceptionMetadata::PopulateMetadataFromException
               (Var metadata,JavascriptExceptionObject *recordedException,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  uint uVar2;
  JavascriptExceptionObject *pJVar3;
  bool bVar4;
  char16 cVar5;
  uint32 uVar6;
  uint uVar7;
  charcount_t cVar8;
  charcount_t cVar9;
  Utf8SourceInfo *this;
  Var pvVar10;
  LPCWSTR content;
  JavascriptString *pJVar11;
  undefined4 *puVar12;
  char16 *buffer;
  DecodeOptions options;
  BufferStringBuilder builder;
  LPCUTF8 functionStart;
  LPCUTF8 puStack_80;
  char16 decodedCharacter;
  LPCUTF8 potentialNewlineStart;
  charcount_t local_70;
  DecodeOptions options_1;
  charcount_t endCharOffset;
  charcount_t startCharOffset;
  charcount_t endByteOffset;
  charcount_t startByteOffset;
  LPCUTF8 functionSource;
  LineOffsetCache *pLStack_50;
  uint32 nextLine;
  LineOffsetCache *cache;
  Utf8SourceInfo *sourceInfo;
  LONG column;
  ULONG line;
  FunctionBody *functionBody;
  ScriptContext *pSStack_28;
  uint32 offset;
  ScriptContext *scriptContext_local;
  JavascriptExceptionObject *recordedException_local;
  Var metadata_local;
  
  pSStack_28 = scriptContext;
  scriptContext_local = (ScriptContext *)recordedException;
  recordedException_local = (JavascriptExceptionObject *)metadata;
  functionBody._4_4_ = JavascriptExceptionObject::GetByteCodeOffset(recordedException);
  _column = JavascriptExceptionObject::GetFunctionBody
                      ((JavascriptExceptionObject *)scriptContext_local);
  this = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)_column);
  bVar4 = Utf8SourceInfo::GetIsLibraryCode(this);
  if ((bVar4) ||
     (bVar4 = FunctionBody::GetLineCharOffset
                        (_column,functionBody._4_4_,(ULONG *)((long)&sourceInfo + 4),
                         (LONG *)&sourceInfo,true), !bVar4)) {
    sourceInfo._4_4_ = 0;
    sourceInfo._0_4_ = 0;
  }
  cache = (LineOffsetCache *)FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)_column);
  Utf8SourceInfo::EnsureLineOffsetCache((Utf8SourceInfo *)cache);
  pLStack_50 = Utf8SourceInfo::GetLineOffsetCache((Utf8SourceInfo *)cache);
  uVar2 = sourceInfo._4_4_;
  uVar6 = LineOffsetCache::GetLineCount(pLStack_50);
  if (uVar2 < uVar6) {
    bVar4 = UInt32Math::Add(sourceInfo._4_4_,1,(uint32 *)((long)&functionSource + 4));
    pJVar3 = recordedException_local;
    if (bVar4) {
      metadata_local._7_1_ = false;
    }
    else {
      pvVar10 = JavascriptNumber::New((double)sourceInfo._4_4_,pSStack_28);
      Js::JavascriptOperators::OP_SetProperty
                (pJVar3,0xf7,pvVar10,pSStack_28,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
      pJVar3 = recordedException_local;
      pvVar10 = JavascriptNumber::New((double)(int)sourceInfo,pSStack_28);
      Js::JavascriptOperators::OP_SetProperty
                (pJVar3,0x2d2,pvVar10,pSStack_28,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
      pJVar3 = recordedException_local;
      pvVar10 = JavascriptNumber::New(0.0,pSStack_28);
      Js::JavascriptOperators::OP_SetProperty
                (pJVar3,0xd1,pvVar10,pSStack_28,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
      pJVar3 = recordedException_local;
      content = ParseableFunctionInfo::GetSourceName(&_column->super_ParseableFunctionInfo);
      pJVar11 = JavascriptString::NewCopySz(content,pSStack_28);
      Js::JavascriptOperators::OP_SetProperty
                (pJVar3,0x2d3,pJVar11,pSStack_28,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
      _endByteOffset =
           Utf8SourceInfo::GetSource
                     ((Utf8SourceInfo *)cache,
                      L"Jsrt::JsExperimentalGetAndClearExceptionWithMetadata");
      startCharOffset = 0;
      endCharOffset = 0;
      options_1 = doDefault;
      local_70 = 0;
      options_1 = LineOffsetCache::GetCharacterOffsetForLine
                            (pLStack_50,sourceInfo._4_4_,&startCharOffset);
      uVar2 = functionSource._4_4_;
      uVar6 = LineOffsetCache::GetLineCount(pLStack_50);
      if (uVar2 < uVar6) {
        local_70 = LineOffsetCache::GetCharacterOffsetForLine
                             (pLStack_50,functionSource._4_4_,&endCharOffset);
        if (_endByteOffset[endCharOffset - 1] == '\n') {
          cVar9 = endCharOffset - 1;
          cVar8 = local_70 - 1;
          if ((cVar9 != 0) && (_endByteOffset[endCharOffset - 2] == '\r')) {
            cVar8 = local_70 - 2;
            cVar9 = endCharOffset - 2;
          }
        }
        else {
          potentialNewlineStart._4_4_ = 1;
          puStack_80 = _endByteOffset + ((ulong)endCharOffset - 3);
          cVar5 = utf8::Decode(&stack0xffffffffffffff80,_endByteOffset + endCharOffset,
                               (DecodeOptions *)((long)&potentialNewlineStart + 4),(bool *)0x0);
          if ((cVar5 == L'\x2028') || (cVar5 == L'\x2029')) {
            endCharOffset = endCharOffset - 3;
          }
          else {
            if (_endByteOffset[endCharOffset - 1] != '\r') {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExceptionMetadata.cpp"
                                          ,0x93,"(0)",
                                          "Line ending logic out of sync between Js::JavascriptExceptionMetadata and Js::LineOffsetCache::GetCharacterOffsetForLine"
                                         );
              if (bVar4) {
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
                return false;
              }
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            endCharOffset = endCharOffset - 1;
          }
          local_70 = local_70 - 1;
          cVar8 = local_70;
          cVar9 = endCharOffset;
        }
      }
      else {
        uVar7 = ParseableFunctionInfo::LengthInBytes(&_column->super_ParseableFunctionInfo);
        cVar8 = ParseableFunctionInfo::StartInDocument(&_column->super_ParseableFunctionInfo);
        endCharOffset = uVar7 + cVar8;
        cVar8 = ParseableFunctionInfo::LengthInChars(&_column->super_ParseableFunctionInfo);
        uVar7 = ParseableFunctionInfo::StartOffset(&_column->super_ParseableFunctionInfo);
        cVar8 = cVar8 + uVar7;
        cVar9 = endCharOffset;
      }
      endCharOffset = cVar9;
      local_70 = cVar8;
      builder.m_string = (WritableString *)(_endByteOffset + startCharOffset);
      BufferStringBuilder::BufferStringBuilder
                ((BufferStringBuilder *)&stack0xffffffffffffff68,local_70 - options_1,pSStack_28);
      bVar4 = Utf8SourceInfo::IsCesu8((Utf8SourceInfo *)cache);
      buffer = BufferStringBuilder::DangerousGetWritableBuffer
                         ((BufferStringBuilder *)&stack0xffffffffffffff68);
      utf8::DecodeUnitsInto
                (buffer,(LPCUTF8 *)&builder,_endByteOffset + endCharOffset,(uint)bVar4,(bool *)0x0);
      pJVar3 = recordedException_local;
      pJVar11 = BufferStringBuilder::ToString((BufferStringBuilder *)&stack0xffffffffffffff68);
      Js::JavascriptOperators::OP_SetProperty
                (pJVar3,0x153,pJVar11,pSStack_28,(PropertyValueInfo *)0x0,PropertyOperation_None,
                 (Var)0x0);
      metadata_local._7_1_ = true;
    }
  }
  else {
    metadata_local._7_1_ = false;
  }
  return metadata_local._7_1_;
}

Assistant:

bool JavascriptExceptionMetadata::PopulateMetadataFromException(Var metadata, JavascriptExceptionObject * recordedException, ScriptContext * scriptContext) {
        uint32 offset = recordedException->GetByteCodeOffset();
        FunctionBody * functionBody = recordedException->GetFunctionBody();
        ULONG line;
        LONG column;
        if (functionBody->GetUtf8SourceInfo()->GetIsLibraryCode() ||
            !functionBody->GetLineCharOffset(offset, &line, &column)) {
            line = 0;
            column = 0;
        }

        Js::Utf8SourceInfo* sourceInfo = functionBody->GetUtf8SourceInfo();
        sourceInfo->EnsureLineOffsetCache();
        LineOffsetCache *cache = sourceInfo->GetLineOffsetCache();

        if (line >= cache->GetLineCount())
        {
            return false;
        }

        uint32 nextLine;
        if (UInt32Math::Add(line, 1, &nextLine))
        {
            // Overflowed
            return false;
        }

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::line,
            Js::JavascriptNumber::New(line, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::column,
            Js::JavascriptNumber::New(column, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::length,
            Js::JavascriptNumber::New(0, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::url,
            Js::JavascriptString::NewCopySz(functionBody->GetSourceName(), scriptContext), scriptContext);

        LPCUTF8 functionSource = sourceInfo->GetSource(_u("Jsrt::JsExperimentalGetAndClearExceptionWithMetadata"));

        charcount_t startByteOffset = 0;
        charcount_t endByteOffset = 0;
        charcount_t startCharOffset = 0;
        charcount_t endCharOffset = 0;

        
        startCharOffset = cache->GetCharacterOffsetForLine(line, &startByteOffset);

        if (nextLine >= cache->GetLineCount())
        {
            endByteOffset = functionBody->LengthInBytes() + functionBody->StartInDocument();
            endCharOffset = functionBody->LengthInChars() + functionBody->StartOffset();
        }
        else
        {
            endCharOffset = cache->GetCharacterOffsetForLine(nextLine, &endByteOffset);

            // The offsets above point to the start of the following line,
            // while we need to find the end of the current line.
            // To do so, just step back over the preceeding newline character(s)
            if (functionSource[endByteOffset - 1] == _u('\n'))
            {
                endCharOffset--;
                endByteOffset--;
                // This may have been \r\n
                if (endByteOffset > 0 && functionSource[endByteOffset - 1] == _u('\r'))
                {
                    endCharOffset--;
                    endByteOffset--;
                }
            }
            else
            {
                utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;
                LPCUTF8 potentialNewlineStart = functionSource + endByteOffset - 3;
                char16 decodedCharacter = utf8::Decode(potentialNewlineStart, functionSource + endByteOffset, options);
                if (decodedCharacter == 0x2028 || decodedCharacter == 0x2029)
                {
                    endCharOffset--;
                    endByteOffset -= 3;
                }
                else if (functionSource[endByteOffset - 1] == _u('\r'))
                {
                    endCharOffset--;
                    endByteOffset--;
                }
                else
                {
                    AssertMsg(FALSE, "Line ending logic out of sync between Js::JavascriptExceptionMetadata and Js::LineOffsetCache::GetCharacterOffsetForLine");
                    return false;
                }
            }
        }

        LPCUTF8 functionStart = functionSource + startByteOffset;

        Js::BufferStringBuilder builder(endCharOffset - startCharOffset, scriptContext);
        utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
        utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), functionStart, functionSource + endByteOffset, options);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::source,
            builder.ToString(), scriptContext);

        return true;
    }